

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestInfo::~TestInfo(TestInfo *this)

{
  TestInfo *this_local;
  
  if (this->factory_ != (TestFactoryBase *)0x0) {
    (*this->factory_->_vptr_TestFactoryBase[1])();
  }
  TestResult::~TestResult(&this->result_);
  internal::CodeLocation::~CodeLocation((CodeLocation *)0x7705ec);
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&this->value_param_);
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&this->type_param_);
  std::__cxx11::string::~string((string *)&this->name_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

TestInfo::~TestInfo() { delete factory_; }